

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O1

void __thiscall
TTD::EventLog::InnerLoopEmitLog
          (EventLog *this,TTDebuggerSourceLocation *writeLocation,char *emitUri,size_t emitUriLength
          )

{
  undefined1 local_78 [8];
  byte buff [72];
  
  NSLogEvents::EventLogEntry_Initialize<(TTD::NSLogEvents::EventKind)14>
            ((EventLogEntry *)local_78,this->m_eventTimeCtr);
  if (local_78._0_4_ == TTDInnerLoopLogWriteTag) {
    buff._8_8_ = TTDebuggerSourceLocation::GetScriptLogTagId(writeLocation);
    buff._16_8_ = TTDebuggerSourceLocation::GetRootEventTime(writeLocation);
    buff._24_8_ = TTDebuggerSourceLocation::GetFunctionTime(writeLocation);
    buff._32_8_ = TTDebuggerSourceLocation::GetLoopTime(writeLocation);
    buff._40_4_ = TTDebuggerSourceLocation::GetTopLevelBodyId(writeLocation);
    buff._44_4_ = TTDebuggerSourceLocation::GetFunctionSourceLine(writeLocation);
    buff._48_4_ = TTDebuggerSourceLocation::GetFunctionSourceColumn(writeLocation);
    buff._52_4_ = TTDebuggerSourceLocation::GetSourceLine(writeLocation);
    buff._56_4_ = TTDebuggerSourceLocation::GetSourceColumn(writeLocation);
    EmitLog(this,emitUri,emitUriLength,(EventLogEntry *)local_78);
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void EventLog::InnerLoopEmitLog(const TTDebuggerSourceLocation& writeLocation, const char* emitUri, size_t emitUriLength)
    {
        //Events are slab allocated with header immediately followed by payload -- we need to replicate this layout here so we allocate an array and explicitly layout.
        //See definition of GetNextAvailableEntry and GetInlineEventDataAs for more detail.
        byte buff[TTD_EVENT_PLUS_DATA_SIZE(NSLogEvents::TTDInnerLoopLogWriteEventLogEntry)];

        NSLogEvents::EventLogEntry* entry = reinterpret_cast<NSLogEvents::EventLogEntry*>(buff);
        NSLogEvents::EventLogEntry_Initialize<NSLogEvents::EventKind::TTDInnerLoopLogWriteTag>(entry, this->m_eventTimeCtr);

        NSLogEvents::TTDInnerLoopLogWriteEventLogEntry* evt = NSLogEvents::GetInlineEventDataAs<NSLogEvents::TTDInnerLoopLogWriteEventLogEntry, NSLogEvents::EventKind::TTDInnerLoopLogWriteTag>(entry);

        evt->SourceScriptLogId = writeLocation.GetScriptLogTagId();
        evt->EventTime = writeLocation.GetRootEventTime();
        evt->FunctionTime = writeLocation.GetFunctionTime();
        evt->LoopTime = writeLocation.GetLoopTime();

        evt->TopLevelBodyId = writeLocation.GetTopLevelBodyId();
        evt->FunctionLine = writeLocation.GetFunctionSourceLine();
        evt->FunctionColumn = writeLocation.GetFunctionSourceColumn();

        evt->Line = writeLocation.GetSourceLine();
        evt->Column = writeLocation.GetSourceColumn();

        this->EmitLog(emitUri, emitUriLength, entry);
    }